

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  uint uVar5;
  int iVar6;
  ImU32 IVar7;
  GetterXsYs<unsigned_int> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  GetterXsYRef<unsigned_int> *pGVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  long lVar19;
  ImDrawIdx IVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  float fVar26;
  float fVar27;
  undefined1 auVar25 [16];
  float fVar28;
  float fVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  pIVar16 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  lVar19 = (long)(((pGVar8->Offset + prim) % iVar18 + iVar18) % iVar18) * (long)pGVar8->Stride;
  uVar5 = *(uint *)((long)pGVar8->Ys + lVar19);
  dVar23 = log10((double)*(uint *)((long)pGVar8->Xs + lVar19) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar16->CurrentPlot;
  dVar1 = pIVar16->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar24 = log10((double)uVar5 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar18 = pTVar9->YAxis;
  pIVar10 = pIVar16->CurrentPlot;
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar6 = pGVar11->Count;
  auVar33._8_8_ = pIVar16->LogDenY[iVar18];
  auVar33._0_8_ = dVar1;
  auVar29._8_8_ = dVar24;
  auVar29._0_8_ = dVar23;
  dVar1 = pGVar11->YRef;
  auVar30 = divpd(auVar29,auVar33);
  dVar23 = pIVar10->YAxis[iVar18].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar18].Min;
  fVar21 = (float)(pIVar16->Mx *
                   (((double)(float)auVar30._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar26 = (float)(pIVar16->My[iVar18] *
                   (((double)(float)auVar30._8_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar23) +
                    dVar23) - dVar23) + (double)IVar4.y);
  dVar24 = log10((double)*(uint *)((long)pGVar11->Xs +
                                  (long)(((prim + pGVar11->Offset) % iVar6 + iVar6) % iVar6) *
                                  (long)pGVar11->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar17->CurrentPlot;
  dVar2 = pIVar17->LogDenX;
  dVar3 = (pIVar10->XAxis).Range.Min;
  dVar23 = (pIVar10->XAxis).Range.Max;
  auVar25._0_8_ = log10(dVar1 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar18 = pTVar9->YAxis;
  auVar25._8_8_ = dVar24;
  auVar14._8_4_ = SUB84(dVar2,0);
  auVar14._0_8_ = pIVar17->LogDenY[iVar18];
  auVar14._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar30 = divpd(auVar25,auVar14);
  pIVar10 = pIVar17->CurrentPlot;
  dVar1 = pIVar10->YAxis[iVar18].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar22 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)auVar30._0_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar27 = (float)(pIVar17->Mx *
                   (((double)(float)auVar30._8_8_ * (dVar23 - dVar3) + dVar3) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  auVar34._0_4_ = ~-(uint)(fVar27 <= fVar21) & (uint)fVar27;
  auVar34._4_4_ = ~-(uint)(fVar22 <= fVar26) & (uint)fVar22;
  auVar34._8_4_ = ~-(uint)(fVar21 < fVar27) & (uint)fVar27;
  auVar34._12_4_ = ~-(uint)(fVar26 < fVar22) & (uint)fVar22;
  auVar30._4_4_ = (uint)fVar26 & -(uint)(fVar22 <= fVar26);
  auVar30._0_4_ = (uint)fVar21 & -(uint)(fVar27 <= fVar21);
  auVar30._8_4_ = (uint)fVar21 & -(uint)(fVar21 < fVar27);
  auVar30._12_4_ = (uint)fVar26 & -(uint)(fVar26 < fVar22);
  auVar34 = auVar34 | auVar30;
  fVar28 = (cull_rect->Min).y;
  auVar15._4_8_ = auVar34._8_8_;
  auVar15._0_4_ = -(uint)(auVar34._4_4_ < fVar28);
  auVar35._0_8_ = auVar15._0_8_ << 0x20;
  auVar35._8_4_ = -(uint)(auVar34._8_4_ < (cull_rect->Max).x);
  auVar35._12_4_ = -(uint)(auVar34._12_4_ < (cull_rect->Max).y);
  auVar36._4_4_ = -(uint)(fVar28 < auVar34._4_4_);
  auVar36._0_4_ = -(uint)((cull_rect->Min).x < auVar34._0_4_);
  auVar36._8_8_ = auVar35._8_8_;
  iVar18 = movmskps((int)cull_rect,auVar36);
  if (iVar18 == 0xf) {
    IVar7 = this->Col;
    IVar4 = *uv;
    fVar28 = fVar22 - fVar26;
    fVar31 = fVar27 - fVar21;
    fVar32 = fVar31 * fVar31 + fVar28 * fVar28;
    if (0.0 < fVar32) {
      fVar32 = 1.0 / SQRT(fVar32);
      fVar28 = fVar28 * fVar32;
      fVar31 = fVar31 * fVar32;
    }
    fVar32 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar28 = fVar32 * fVar28;
    fVar32 = fVar32 * fVar31;
    (pIVar12->pos).x = fVar28 + fVar21;
    (pIVar12->pos).y = fVar26 - fVar32;
    (pIVar12->uv).x = IVar4.x;
    (pIVar12->uv).y = IVar4.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar7;
    pIVar12[1].pos.x = fVar28 + fVar27;
    pIVar12[1].pos.y = fVar22 - fVar32;
    pIVar12[1].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar27 - fVar28;
    pIVar12[2].pos.y = fVar32 + fVar22;
    pIVar12[2].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    pIVar12[3].pos.x = fVar21 - fVar28;
    pIVar12[3].pos.y = fVar32 + fVar26;
    pIVar12[3].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar20 = (ImDrawIdx)uVar5;
    *pIVar13 = IVar20;
    pIVar13[1] = IVar20 + 1;
    pIVar13[2] = IVar20 + 2;
    pIVar13[3] = IVar20;
    pIVar13[4] = IVar20 + 2;
    pIVar13[5] = IVar20 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }